

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O3

int run_test_udp_create_early_bad_bind(void)

{
  ushort uVar1;
  int iVar2;
  ushort *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uv_os_fd_t fd;
  int namelen;
  sockaddr_in6 sockname;
  sockaddr_in addr;
  uv_udp_t client;
  undefined1 auStack_208 [216];
  code *pcStack_130;
  int local_11c [2];
  int local_114 [7];
  undefined1 local_f8 [16];
  long local_e8 [27];
  
  pcStack_130 = (code *)0x18759c;
  iVar2 = uv_interface_addresses(local_e8,local_114);
  if (iVar2 != 0) {
LAB_001876f7:
    pcStack_130 = (code *)0x1876fc;
    run_test_udp_create_early_bad_bind_cold_1();
    return 1;
  }
  if ((long)local_114[0] < 1) {
    pcStack_130 = (code *)0x1876f7;
    uv_free_interface_addresses();
    goto LAB_001876f7;
  }
  puVar3 = (ushort *)(local_e8[0] + 0x14);
  uVar5 = 1;
  do {
    uVar1 = *puVar3;
    uVar6 = (ulong)uVar1;
    if (uVar1 == 10) break;
    puVar3 = puVar3 + 0x28;
    bVar7 = uVar5 < (ulong)(long)local_114[0];
    uVar5 = uVar5 + 1;
  } while (bVar7);
  pcStack_130 = (code *)0x1875de;
  uv_free_interface_addresses();
  if (uVar1 != 10) goto LAB_001876f7;
  pcStack_130 = (code *)0x1875fe;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_f8);
  if (iVar2 == 0) {
    pcStack_130 = (code *)0x18760b;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x18761d;
    iVar2 = uv_udp_init_ex(uVar4,local_e8,10);
    if (iVar2 != 0) goto LAB_00187708;
    pcStack_130 = (code *)0x187634;
    iVar2 = uv_fileno(local_e8,local_11c);
    if (iVar2 != 0) goto LAB_0018770d;
    if (local_11c[0] == -1) goto LAB_00187712;
    local_11c[1] = 0x1c;
    pcStack_130 = (code *)0x187661;
    iVar2 = uv_udp_getsockname(local_e8,local_114);
    if (iVar2 != 0) goto LAB_00187717;
    if ((short)local_114[0] != 10) goto LAB_0018771c;
    pcStack_130 = (code *)0x187686;
    iVar2 = uv_udp_bind(local_e8,local_f8,0);
    if (iVar2 != -0x16) goto LAB_00187721;
    uVar6 = 0;
    pcStack_130 = (code *)0x18769d;
    uv_close(local_e8,0);
    pcStack_130 = (code *)0x1876a2;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1876ac;
    uv_run(uVar4,0);
    pcStack_130 = (code *)0x1876b1;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1876c5;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_130 = (code *)0x1876cf;
    uv_run(uVar4,0);
    pcStack_130 = (code *)0x1876d4;
    uVar4 = uv_default_loop();
    pcStack_130 = (code *)0x1876dc;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      pcStack_130 = (code *)0x1876e5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_130 = (code *)0x187708;
    run_test_udp_create_early_bad_bind_cold_2();
LAB_00187708:
    pcStack_130 = (code *)0x18770d;
    run_test_udp_create_early_bad_bind_cold_3();
LAB_0018770d:
    pcStack_130 = (code *)0x187712;
    run_test_udp_create_early_bad_bind_cold_4();
LAB_00187712:
    pcStack_130 = (code *)0x187717;
    run_test_udp_create_early_bad_bind_cold_9();
LAB_00187717:
    pcStack_130 = (code *)0x18771c;
    run_test_udp_create_early_bad_bind_cold_5();
LAB_0018771c:
    pcStack_130 = (code *)0x187721;
    run_test_udp_create_early_bad_bind_cold_6();
LAB_00187721:
    pcStack_130 = (code *)0x187726;
    run_test_udp_create_early_bad_bind_cold_7();
  }
  pcStack_130 = run_test_udp_create_early_bad_domain;
  run_test_udp_create_early_bad_bind_cold_8();
  pcStack_130 = (code *)uVar6;
  uVar4 = uv_default_loop();
  iVar2 = uv_udp_init_ex(uVar4,auStack_208,0x2f);
  if (iVar2 == -0x16) {
    uVar4 = uv_default_loop();
    iVar2 = uv_udp_init_ex(uVar4,auStack_208,0x400);
    if (iVar2 == -0x16) {
      uVar4 = uv_default_loop();
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001877c8;
    }
  }
  else {
    run_test_udp_create_early_bad_domain_cold_1();
  }
  run_test_udp_create_early_bad_domain_cold_2();
LAB_001877c8:
  run_test_udp_create_early_bad_domain_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(uVar4,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_udp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}